

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

bool __thiscall
HEkk::isBadBasisChange
          (HEkk *this,SimplexAlgorithm algorithm,HighsInt variable_in,HighsInt row_out,
          HighsInt rebuild_reason)

{
  HighsInt *pHVar1;
  uint index;
  pointer pHVar2;
  ValueType *pVVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t currhash;
  
  if (rebuild_reason != 0) {
    return false;
  }
  if (row_out != -1 && variable_in != -1) {
    currhash = (this->basis_).hash;
    index = (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[row_out];
    HighsHashHelpers::sparse_inverse_combine(&currhash,index);
    HighsHashHelpers::sparse_combine(&currhash,variable_in);
    pVVar3 = HighsHashTable<unsigned_long,_void>::find(&this->visited_basis_,&currhash);
    if (pVVar3 != (ValueType *)0x0) {
      if (this->iteration_count_ == this->previous_iteration_cycling_detected + 1) {
        if (algorithm == kDual) {
          pHVar1 = &(this->analysis_).num_dual_cycling_detections;
          *pHVar1 = *pHVar1 + 1;
        }
        else {
          pHVar1 = &(this->analysis_).num_primal_cycling_detections;
          *pHVar1 = *pHVar1 + 1;
        }
        highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kWarning,
                    " basis change (%d out; %d in) is bad\n",(ulong)index,(ulong)(uint)variable_in);
        addBadBasisChange(this,row_out,index,variable_in,kCycling,true);
        return true;
      }
      this->previous_iteration_cycling_detected = this->iteration_count_;
    }
    pHVar2 = (this->bad_basis_change_).
             super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (ulong)((long)(this->bad_basis_change_).
                          super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar2) >> 5;
    uVar6 = 0;
    uVar5 = uVar4 & 0xffffffff;
    if ((int)uVar4 < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 * 0x20 != uVar6; uVar6 = uVar6 + 0x20) {
      if (((*(uint *)((long)&pHVar2->variable_out + uVar6) == index) &&
          (*(int *)((long)&pHVar2->variable_in + uVar6) == variable_in)) &&
         (*(int *)((long)&pHVar2->row_out + uVar6) == row_out)) {
        (&pHVar2->taboo)[uVar6] = true;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool HEkk::isBadBasisChange(const SimplexAlgorithm algorithm,
                            const HighsInt variable_in, const HighsInt row_out,
                            const HighsInt rebuild_reason) {
  if (rebuild_reason) return false;
  if (variable_in == -1 || row_out == -1) return false;
  uint64_t currhash = basis_.hash;
  HighsInt variable_out = basis_.basicIndex_[row_out];

  HighsHashHelpers::sparse_inverse_combine(currhash, variable_out);
  HighsHashHelpers::sparse_combine(currhash, variable_in);

  bool cycling_detected = false;
  const bool posible_cycling = visited_basis_.find(currhash) != nullptr;
  if (posible_cycling) {
    if (iteration_count_ == previous_iteration_cycling_detected + 1) {
      // Cycling detected on successive iterations suggests infinite cycling
      //      highsLogDev(options_->log_options, HighsLogType::kWarning,
      //		  "Cycling detected in %s simplex:");
      // printf("Cycling detected in %s simplex solve %d (Iteration %d)",
      //        algorithm == SimplexAlgorithm::kPrimal ? "primal" : "dual",
      //        (int)debug_solve_call_num_, (int)iteration_count_);
      cycling_detected = true;
    } else {
      previous_iteration_cycling_detected = iteration_count_;
    }
  }
  if (cycling_detected) {
    if (algorithm == SimplexAlgorithm::kDual) {
      analysis_.num_dual_cycling_detections++;
    } else {
      analysis_.num_primal_cycling_detections++;
    }
    highsLogDev(options_->log_options, HighsLogType::kWarning,
                " basis change (%d out; %d in) is bad\n", (int)variable_out,
                (int)variable_in);
    addBadBasisChange(row_out, variable_out, variable_in,
                      BadBasisChangeReason::kCycling, true);
    return true;
  } else {
    // Look to see whether this basis change is in the list of bad
    // ones
    for (HighsInt iX = 0; iX < (HighsInt)bad_basis_change_.size(); iX++) {
      if (bad_basis_change_[iX].variable_out == variable_out &&
          bad_basis_change_[iX].variable_in == variable_in &&
          bad_basis_change_[iX].row_out == row_out) {
        bad_basis_change_[iX].taboo = true;
        return true;
      }
    }
  }

  return false;
}